

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_buffer_method_decode(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  TRef TVar3;
  IRType t_00;
  IRType t;
  TRef trr;
  TRef tmp;
  TRef trbuf;
  TRef ud;
  RecordFFData *rd_local;
  jit_State *J_local;
  TRef fref;
  
  TVar1 = recff_sbufx_check(J,rd,0);
  TVar2 = recff_sbufx_write(J,TVar1);
  TVar3 = recff_tmpref(J,0x7fff,2);
  TVar2 = lj_ir_call(J,IRCALL_lj_serialize_get,(ulong)TVar2,(ulong)TVar3);
  t_00 = lj_serialize_peektype((SBufExt *)((rd->argv->u64 & 0x7fffffffffff) + 0x30));
  TVar3 = lj_record_vload(J,TVar3,0,t_00);
  *J->base = TVar3;
  (J->fold).ins.field_0.ot = 0x3e09;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = 0x13;
  TVar1 = lj_opt_fold(J);
  (J->fold).ins.field_0.ot = 0x4d09;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  lj_opt_fold(J);
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_decode(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  TRef trbuf = recff_sbufx_write(J, ud);
  TRef tmp = recff_tmpref(J, TREF_NIL, IRTMPREF_OUT1);
  TRef trr = lj_ir_call(J, IRCALL_lj_serialize_get, trbuf, tmp);
  IRType t = (IRType)lj_serialize_peektype(bufV(&rd->argv[0]));
  /* No IR_USE needed, since the call is a store. */
  J->base[0] = lj_record_vload(J, tmp, 0, t);
  /* The sbx->r store must be after the VLOAD type check, in case it fails. */
  recff_sbufx_set_ptr(J, ud, IRFL_SBUF_R, trr);
}